

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

bool bssl::anon_unknown_0::QUICMethodTest::ProvideHandshakeData(SSL *ssl,size_t num)

{
  ssl_encryption_level_t level_00;
  bool bVar1;
  int iVar2;
  MockQUICTransport *this;
  uchar *data_00;
  size_type len;
  bool local_59;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  ssl_encryption_level_t level;
  MockQUICTransport *transport;
  size_t num_local;
  SSL *ssl_local;
  
  this = TransportFromSSL(ssl);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = SSL_quic_read_level(ssl);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  bVar1 = MockQUICTransport::ReadHandshakeData
                    (this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
                     data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,num);
  level_00 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
  local_59 = false;
  if (bVar1) {
    data_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    len = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    iVar2 = SSL_provide_quic_data(ssl,level_00,data_00,len);
    local_59 = iVar2 != 0;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return local_59;
}

Assistant:

static bool ProvideHandshakeData(
      SSL *ssl, size_t num = std::numeric_limits<size_t>::max()) {
    MockQUICTransport *transport = TransportFromSSL(ssl);
    ssl_encryption_level_t level = SSL_quic_read_level(ssl);
    std::vector<uint8_t> data;
    return transport->ReadHandshakeData(&data, level, num) &&
           SSL_provide_quic_data(ssl, level, data.data(), data.size());
  }